

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void ctemplate::EmitMissingInclude
               (char *filename,ExpandEmitter *output_buffer,PerExpandData *per_expand_data)

{
  TemplateAnnotator *pTVar1;
  ostream *poVar2;
  allocator local_41;
  string local_40 [32];
  
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar1 = PerExpandData::annotator(per_expand_data);
    std::__cxx11::string::string(local_40,filename,&local_41);
    (*pTVar1->_vptr_TemplateAnnotator[10])(pTVar1,output_buffer,local_40);
    std::__cxx11::string::~string(local_40);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  poVar2 = std::operator<<(poVar2,"Failed to load included template: \"");
  poVar2 = std::operator<<(poVar2,filename);
  std::operator<<(poVar2,"\"\n");
  return;
}

Assistant:

static void EmitMissingInclude(const char* const filename,
                               ExpandEmitter *output_buffer,
                               PerExpandData *per_expand_data) {
  // if there was a problem retrieving the template, bail!
  if (per_expand_data->annotate()) {
    TemplateAnnotator* annotator = per_expand_data->annotator();
    annotator->EmitFileIsMissing(output_buffer, filename);
  }
  LOG(ERROR) << "Failed to load included template: \"" << filename << "\"\n";
}